

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O3

size_t sznet::detail::convertHex(char *buf,uintptr_t value)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  
  sVar2 = 0;
  pcVar3 = buf + -1;
  do {
    pcVar4 = pcVar3;
    sVar2 = sVar2 + 1;
    pcVar4[1] = "0123456789ABCDEF"[(uint)value & 0xf];
    pcVar3 = pcVar4 + 1;
    bVar5 = 0xf < value;
    value = value >> 4;
  } while (bVar5);
  pcVar4[2] = '\0';
  if (buf < pcVar3) {
    pcVar4 = buf + 1;
    do {
      cVar1 = pcVar4[-1];
      pcVar4[-1] = *pcVar3;
      *pcVar3 = cVar1;
      pcVar3 = pcVar3 + -1;
      bVar5 = pcVar4 < pcVar3;
      pcVar4 = pcVar4 + 1;
    } while (bVar5);
  }
  return sVar2;
}

Assistant:

size_t convertHex(char buf[], uintptr_t value)
	{
		uintptr_t i = value;
		char* p = buf;
		do
		{
			int lsd = static_cast<int>(i % 16);
			i /= 16;
			*p++ = digitsHex[lsd];
		} while (i != 0);
		*p = '\0';
		std::reverse(buf, p);
		return p - buf;
	}